

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception-test.c++
# Opt level: O2

void __thiscall kj::_::anon_unknown_0::TestCase129::run(TestCase129 *this)

{
  ExceptionCallback *this_00;
  DebugExpression<bool> _kjCondition;
  NullableValue<kj::Exception> _e130;
  NullableValue<kj::Exception> local_338;
  StringPtr local_1a0 [25];
  
  this_00 = (ExceptionCallback *)operator_new(0x10);
  ExceptionCallback::ExceptionCallback(this_00);
  local_338._0_8_ = local_338._0_8_ & 0xffffffffffffff00;
  NullableValue<kj::Exception>::NullableValue(&_e130,&local_338);
  NullableValue<kj::Exception>::~NullableValue(&local_338);
  if (_e130.isSet == true) {
    if (_e130.field_1.value.description.content.size_ == 0) {
      _e130.field_1.value.description.content.ptr = "";
    }
    local_338.field_1.value.ownFile.content.ptr =
         (char *)(_e130.field_1.value.description.content.size_ +
                 (_e130.field_1.value.description.content.size_ == 0));
    local_1a0[0].content.ptr = "must be allocated on the stack";
    local_1a0[0].content.size_ = 0x1f;
    local_338._0_8_ = _e130.field_1.value.description.content.ptr;
    _kjCondition.value = StringPtr::contains((StringPtr *)&local_338,local_1a0);
    if (Debug::minSeverity < 3 && !_kjCondition.value) {
      Debug::log<char_const(&)[79],kj::_::DebugExpression<bool>&,char_const(&)[56],kj::Exception&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
                 ,0x82,ERROR,
                 "\"failed: expected \" \"e.getDescription().contains(\\\"must be allocated on the stack\\\")\", _kjCondition, \"exception description didn\'t contain expected substring\", e"
                 ,(char (*) [79])
                  "failed: expected e.getDescription().contains(\"must be allocated on the stack\")"
                 ,&_kjCondition,
                 (char (*) [56])"exception description didn\'t contain expected substring",
                 &_e130.field_1.value);
    }
  }
  else if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[42]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
               ,0x82,ERROR,"\"code did not throw: \" \"new ExceptionCallback\"",
               (char (*) [42])"code did not throw: new ExceptionCallback");
  }
  NullableValue<kj::Exception>::~NullableValue(&_e130);
  return;
}

Assistant:

TEST(Exception, ExceptionCallbackMustBeOnStack) {
  KJ_EXPECT_THROW_MESSAGE("must be allocated on the stack", new ExceptionCallback);
}